

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

ValueEntry * __thiscall
de::Random::
chooseWeighted<rsg::ValueEntry_const*,__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
          (Random *this,
          __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
          first,__normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                last,__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> weight)

{
  ValueEntry **ppVVar1;
  int iVar2;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var3;
  ValueEntry **ppVVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = 0.0;
  for (iVar2 = 0; first._M_current + iVar2 != last._M_current; iVar2 = iVar2 + 1) {
    fVar5 = fVar5 + weight._M_current[iVar2];
  }
  fVar6 = deRandom_getFloat(&this->m_rnd);
  iVar2 = 0;
  fVar7 = 0.0;
  _Var3._M_current = last._M_current;
  while( true ) {
    ppVVar1 = first._M_current + iVar2;
    ppVVar4 = _Var3._M_current;
    if (ppVVar1 == last._M_current) break;
    fVar7 = fVar7 + weight._M_current[iVar2];
    ppVVar4 = ppVVar1;
    if (fVar5 * fVar6 + 0.0 < fVar7) break;
    if (0.0 < weight._M_current[iVar2]) {
      _Var3._M_current = ppVVar1;
    }
    iVar2 = iVar2 + 1;
  }
  return *ppVVar4;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}